

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O0

int bbuf_clone(BBuf **rto,BBuf *from)

{
  BBuf *buf;
  BBuf *to;
  int r;
  BBuf *from_local;
  BBuf **rto_local;
  
  buf = (BBuf *)malloc(0x10);
  *rto = buf;
  if (buf == (BBuf *)0x0) {
    rto_local._4_4_ = -5;
  }
  else {
    rto_local._4_4_ = bbuf_init(buf,from->alloc);
    if (rto_local._4_4_ == 0) {
      buf->used = from->used;
      memcpy(buf->p,from->p,(ulong)from->used);
      rto_local._4_4_ = 0;
    }
    else {
      bbuf_free(buf);
      *rto = (BBuf *)0x0;
    }
  }
  return rto_local._4_4_;
}

Assistant:

static int
bbuf_clone(BBuf** rto, BBuf* from)
{
  int r;
  BBuf *to;

  *rto = to = (BBuf* )xmalloc(sizeof(BBuf));
  CHECK_NULL_RETURN_MEMERR(to);
  r = BB_INIT(to, from->alloc);
  if (r != 0) {
    bbuf_free(to);
    *rto = 0;
    return r;
  }
  to->used = from->used;
  xmemcpy(to->p, from->p, from->used);
  return 0;
}